

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogComboBox::setHistory(QFileDialogComboBox *this,QStringList *paths)

{
  QFileSystemModel *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QUrl url;
  QArrayData *local_c0;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  undefined8 local_98;
  QUrl local_90;
  undefined8 local_88;
  undefined1 *puStack_80;
  long *local_78;
  QArrayDataPointer<QUrl> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<QString>::operator=(&(this->m_history).d,&paths->d);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QUrl *)0x0;
  local_68.size = 0;
  local_78 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->d_ptr->model;
  if (pQVar1 == (QFileSystemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = L"/";
    local_48._16_8_ = 1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  QFileSystemModel::index((QString *)&local_88,(int)pQVar1);
  if ((QArrayData *)local_48.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_48.shared = *(int *)local_48.shared + -1;
    UNLOCK();
    if (*(int *)local_48.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_48.shared,2,0x10);
    }
  }
  local_90.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  if ((int)(local_88._4_4_ | (uint)local_88) < 0 || local_78 == (long *)0x0) {
    QVar3.m_data = (storage_type *)0x5;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar3);
    local_a8 = (QArrayData *)local_48.shared;
    pcStack_a0 = (char16_t *)local_48._8_8_;
    local_98 = local_48._16_8_;
    QUrl::QUrl(&local_90,(QString *)&local_a8,TolerantMode);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,0x10);
      }
    }
  }
  else {
    (**(code **)(*local_78 + 0x90))(&local_48,local_78,&local_88,0x101);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)&local_a8);
    QUrl::fromLocalFile((QString *)&local_90);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,0x10);
      }
    }
    if (local_c0 != (QArrayData *)0x0) {
      LOCK();
      (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c0,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  cVar2 = QUrl::isValid();
  if (cVar2 != '\0') {
    QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
              ((QMovableArrayOps<QUrl> *)&local_68,local_68.size,&local_90);
    QList<QUrl>::end((QList<QUrl> *)&local_68);
  }
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&local_68);
  QUrl::~QUrl(&local_90);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::setHistory(const QStringList &paths)
{
    m_history = paths;
    // Only populate the first item, showPopup will populate the rest if needed
    QList<QUrl> list;
    const QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    //On windows the popup display the "C:\", convert to nativeSeparators
    const QUrl url = idx.isValid()
                   ? QUrl::fromLocalFile(QDir::toNativeSeparators(idx.data(QFileSystemModel::FilePathRole).toString()))
                   : QUrl("file:"_L1);
    if (url.isValid())
        list.append(url);
    urlModel->setUrls(list);
}